

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treemodel.cpp
# Opt level: O2

UModelIndex * __thiscall
TreeModel::findParentOfType
          (UModelIndex *__return_storage_ptr__,TreeModel *this,UModelIndex *index,UINT8 type)

{
  bool bVar1;
  UModelIndex parent;
  UModelIndex local_58;
  UModelIndex local_40;
  
  bVar1 = UModelIndex::isValid(index);
  if (bVar1) {
    UModelIndex::parent(&local_58,index);
    if (((-1 < local_58.r) && (-1 < (long)local_58._0_8_)) && (local_58.m != (TreeModel *)0x0)) {
      UModelIndex::parent(&local_58,index);
      while (((TreeItem *)local_58.i != (TreeItem *)0x0 &&
             (this->rootItem != (TreeItem *)local_58.i))) {
        if (*(UINT8 *)(local_58.i + 0x1d) == type) {
          __return_storage_ptr__->m = local_58.m;
          __return_storage_ptr__->r = local_58.r;
          __return_storage_ptr__->c = local_58.c;
          __return_storage_ptr__->i = local_58.i;
          return __return_storage_ptr__;
        }
        UModelIndex::parent(&local_40,&local_58);
        local_58.m = local_40.m;
        local_58.r = local_40.r;
        local_58.c = local_40.c;
        local_58.i = local_40.i;
      }
    }
  }
  __return_storage_ptr__->r = -1;
  __return_storage_ptr__->c = -1;
  __return_storage_ptr__->i = 0;
  __return_storage_ptr__->m = (TreeModel *)0x0;
  return __return_storage_ptr__;
}

Assistant:

UModelIndex TreeModel::findParentOfType(const UModelIndex& index, UINT8 type) const
{
    if (!index.isValid() || !index.parent().isValid())
        return UModelIndex();
    
    TreeItem *item;
    UModelIndex parent = index.parent();
    
    for (item = static_cast<TreeItem*>(parent.internalPointer());
         item != NULL && item != rootItem && item->type() != type;
         item = static_cast<TreeItem*>(parent.internalPointer()))
        parent = parent.parent();
    if (item != NULL && item != rootItem)
        return parent;
    
    return UModelIndex();
}